

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O3

void __thiscall
Assimp::COBImporter::ReadGrou_Binary
          (COBImporter *this,Scene *out,StreamReaderLE *reader,ChunkInfo *nfo)

{
  Node *msh;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  _Elt_pointer psVar4;
  ChunkInfo *pCVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  chunk_guard cn;
  undefined1 local_59;
  element_type *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_50 [2];
  chunk_guard local_40;
  shared_ptr<Assimp::COB::Node> local_28;
  
  if (2 < nfo->version) {
    UnsupportedChunk_Binary(this,reader,nfo,"Grou");
    return;
  }
  local_40.cur = (long)(*(int *)&reader->current - *(int *)&reader->buffer);
  local_58 = (element_type *)0x0;
  pCVar5 = nfo;
  local_40.nfo = nfo;
  local_40.reader = reader;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Assimp::COB::Group,std::allocator<Assimp::COB::Group>>
            (a_Stack_50,(Group **)&local_58,(allocator<Assimp::COB::Group> *)&local_59);
  local_28.super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_58;
  local_28.super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       a_Stack_50[0]._M_pi;
  local_58 = (element_type *)0x0;
  a_Stack_50[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::deque<std::shared_ptr<Assimp::COB::Node>,std::allocator<std::shared_ptr<Assimp::COB::Node>>>
  ::emplace_back<std::shared_ptr<Assimp::COB::Node>>
            ((deque<std::shared_ptr<Assimp::COB::Node>,std::allocator<std::shared_ptr<Assimp::COB::Node>>>
              *)out,&local_28);
  if (local_28.super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  this_00._M_pi = a_Stack_50[0]._M_pi;
  if (a_Stack_50[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_50[0]._M_pi);
  }
  psVar4 = (out->nodes).
           super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (psVar4 == (out->nodes).
                super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pCVar5 = (ChunkInfo *)
             (out->nodes).
             super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node;
    psVar4 = (_Elt_pointer)(*(long *)&pCVar5[-1].version + 0x200);
  }
  msh = psVar4[-1].super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar1 = nfo->parent_id;
  uVar2 = nfo->version;
  uVar3 = nfo->size;
  (msh->super_ChunkInfo).id = nfo->id;
  (msh->super_ChunkInfo).parent_id = uVar1;
  (msh->super_ChunkInfo).version = uVar2;
  (msh->super_ChunkInfo).size = uVar3;
  ReadBasicNodeInfo_Binary((COBImporter *)this_00._M_pi,msh,reader,pCVar5);
  chunk_guard::~chunk_guard(&local_40);
  return;
}

Assistant:

void COBImporter::ReadGrou_Binary(COB::Scene& out, StreamReaderLE& reader, const ChunkInfo& nfo)
{
    if(nfo.version > 2) {
        return UnsupportedChunk_Binary(reader,nfo,"Grou");
    }

    const chunk_guard cn(nfo,reader);

    out.nodes.push_back(std::make_shared<Group>());
    Group& msh = (Group&)(*out.nodes.back().get());
    msh = nfo;

    ReadBasicNodeInfo_Binary(msh,reader,nfo);
}